

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
::
unchecked_insert<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
           *this,pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
                 *x)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong hash;
  locator res;
  locator lStack_28;
  
  sVar2 = slang::
          hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
          ::operator()((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                        *)this,&x->first);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  hash = SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),0);
  nosize_unchecked_emplace_at<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>const&>
            (&lStack_28,this,(arrays_type *)this,hash >> ((byte)*this & 0x3f),hash,x);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  return;
}

Assistant:

void unchecked_insert(Value&& x) {
        auto hash = hash_for(key_from(x));
        unchecked_emplace_at(position_for(hash), hash, std::forward<Value>(x));
    }